

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

string * google::protobuf::strings::CHexEscape(string *__return_storage_ptr__,string *src)

{
  int src_len;
  int iVar1;
  int iVar2;
  _Head_base<0UL,_char_*,_false> dest_00;
  LogMessage *other;
  LogMessage local_78;
  _Head_base<0UL,_char_*,_false> local_40;
  unique_ptr<char[],_std::default_delete<char[]>_> dest;
  
  src_len = (int)src->_M_string_length;
  iVar2 = src_len * 4 + 1;
  iVar1 = -1;
  if (-1 < src_len * 4) {
    iVar1 = iVar2;
  }
  dest_00._M_head_impl = (char *)operator_new__((long)iVar1);
  local_40._M_head_impl = dest_00._M_head_impl;
  iVar2 = CEscapeInternal((src->_M_dataplus)._M_p,src_len,dest_00._M_head_impl,iVar2,true,false);
  if (iVar2 < 0) {
    protobuf::internal::LogMessage::LogMessage
              (&local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/strutil.cc"
               ,0x26d);
    other = protobuf::internal::LogMessage::operator<<(&local_78,"CHECK failed: (len) >= (0): ");
    protobuf::internal::LogFinisher::operator=
              ((LogFinisher *)
               ((long)&dest._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                       super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                       super__Head_base<0UL,_char_*,_false>._M_head_impl + 7),other);
    protobuf::internal::LogMessage::~LogMessage(&local_78);
    dest_00._M_head_impl = local_40._M_head_impl;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,dest_00._M_head_impl,dest_00._M_head_impl + iVar2);
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

string CHexEscape(const string& src) {
  const int dest_length = src.size() * 4 + 1; // Maximum possible expansion
  std::unique_ptr<char[]> dest(new char[dest_length]);
  const int len = CEscapeInternal(src.data(), src.size(),
                                  dest.get(), dest_length, true, false);
  GOOGLE_DCHECK_GE(len, 0);
  return string(dest.get(), len);
}